

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

printer * __thiscall
boost::ext::ut::v1_1_8::printer::operator<<
          (printer *this,
          eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          *op)

{
  printer *ppVar1;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  string_view local_28;
  
  local_28 = color(this,op->value_);
  ppVar1 = operator<<(this,&local_28);
  local_38._M_len = (op->lhs_)._M_len;
  local_38._M_str = (op->lhs_)._M_str;
  ppVar1 = operator<<(ppVar1,&local_38);
  std::operator<<((ostream *)&ppVar1->field_0x40," == ");
  local_48._M_len = (op->rhs_)._M_len;
  local_48._M_str = (op->rhs_)._M_str;
  ppVar1 = operator<<(ppVar1,&local_48);
  ppVar1 = operator<<(ppVar1,(basic_string_view<char,_std::char_traits<char>_> *)this);
  return ppVar1;
}

Assistant:

auto& operator<<(const detail::eq_<TLhs, TRhs>& op) {
      return (*this << color(op) << op.lhs() << " == " << op.rhs()
                    << colors_.none);
    }